

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void drft_backward(drft_lookup *l,float *data)

{
  int iVar1;
  int ip;
  float *pfVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int l1;
  int ido;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  iVar1 = l->n;
  lVar4 = (long)iVar1;
  if (lVar4 != 1) {
    pfVar2 = l->trigcache;
    piVar3 = l->splitcache;
    lVar5 = (long)piVar3[1];
    uVar8 = 0;
    if (0 < lVar5) {
      lVar9 = 0;
      iVar10 = 1;
      l1 = 1;
      do {
        ip = piVar3[lVar9 + 2];
        ido = iVar1 / (ip * l1);
        if (ip == 2) {
          pfVar6 = pfVar2;
          pfVar7 = data;
          if (uVar8 != 0) {
            pfVar6 = data;
            pfVar7 = pfVar2;
          }
          dradb2(ido,l1,pfVar7,pfVar6,pfVar2 + lVar4 + (long)iVar10 + -1);
LAB_001dc308:
          uVar8 = 1 - uVar8;
        }
        else {
          if (ip == 3) {
            pfVar6 = pfVar2;
            pfVar7 = data;
            if (uVar8 != 0) {
              pfVar6 = data;
              pfVar7 = pfVar2;
            }
            dradb3(ido,l1,pfVar7,pfVar6,pfVar2 + lVar4 + (long)iVar10 + -1,
                   pfVar2 + lVar4 + (long)(ido + iVar10) + -1);
            goto LAB_001dc308;
          }
          if (ip == 4) {
            pfVar6 = pfVar2;
            pfVar7 = data;
            if (uVar8 != 0) {
              pfVar6 = data;
              pfVar7 = pfVar2;
            }
            dradb4(ido,l1,pfVar7,pfVar6,pfVar2 + lVar4 + (long)iVar10 + -1,
                   pfVar2 + lVar4 + (long)(ido + iVar10) + -1,
                   pfVar2 + lVar4 + (long)(ido + iVar10 + ido) + -1);
            goto LAB_001dc308;
          }
          pfVar6 = data;
          pfVar7 = pfVar2;
          if (uVar8 != 0) {
            pfVar6 = pfVar2;
            pfVar7 = data;
          }
          dradbg(ido,ip,l1,ido * l1,pfVar6,pfVar6,pfVar6,pfVar7,pfVar7,
                 pfVar2 + lVar4 + (long)iVar10 + -1);
          if (ido == 1) {
            uVar8 = 1 - uVar8;
          }
        }
        iVar10 = iVar10 + (ip + -1) * ido;
        lVar9 = lVar9 + 1;
        l1 = ip * l1;
      } while (lVar5 != lVar9);
      uVar8 = (uint)(uVar8 != 0);
    }
    if ((0 < iVar1) && ((char)uVar8 != '\0')) {
      lVar5 = 0;
      do {
        data[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  return;
}

Assistant:

void drft_backward(drft_lookup *l,float *data){
  if (l->n==1)return;
  drftb1(l->n,data,l->trigcache,l->trigcache+l->n,l->splitcache);
}